

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

void __thiscall
cnn::Exp::forward_impl
          (Exp *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  Index index_1;
  ulong uVar4;
  long lVar5;
  Index index;
  ulong uVar6;
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  float fVar26;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_70;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_50;
  
  Tensor::operator*(&local_50,
                    *(xs->
                     super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
                     _M_impl.super__Vector_impl_data._M_start);
  Tensor::operator*(&local_70,fx);
  if ((local_70.
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_rows.m_value ==
       local_50.
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_rows.m_value) &&
     (local_70.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value ==
      local_50.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value)) {
    uVar2 = local_70.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_cols.m_value *
            local_70.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_rows.m_value;
    uVar6 = uVar2;
    if ((((ulong)local_70.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_data & 3) == 0) &&
       (uVar6 = (ulong)(-((uint)((ulong)local_70.
                                        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                        .
                                        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                        .m_data >> 2) & 0x3fffffff) & 0xf),
       (long)uVar2 <= (long)uVar6)) {
      uVar6 = uVar2;
    }
    uVar1 = uVar2 - uVar6;
    uVar4 = uVar1 + 0xf;
    if (-1 < (long)uVar1) {
      uVar4 = uVar1;
    }
    if (0 < (long)uVar6) {
      uVar3 = 0;
      do {
        fVar26 = expf(local_50.
                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                      .
                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                      .m_data[uVar3]);
        local_70.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data[uVar3] = fVar26;
        uVar3 = uVar3 + 1;
      } while (uVar6 != uVar3);
    }
    lVar5 = (uVar4 & 0xfffffffffffffff0) + uVar6;
    if (0xf < (long)uVar1) {
      auVar7 = vbroadcastss_avx512f(ZEXT416(0x42b0c0a6));
      auVar8 = vbroadcastss_avx512f(ZEXT416(0xc2b0c0a5));
      auVar9 = vbroadcastss_avx512f(ZEXT416(0x3f000000));
      auVar10 = vbroadcastss_avx512f(ZEXT416(0x3fb8aa3b));
      auVar11 = vbroadcastss_avx512f(ZEXT416(0xbf317218));
      auVar12 = vbroadcastss_avx512f(ZEXT416(0x39506967));
      auVar13 = vbroadcastss_avx512f(ZEXT416(0x3ab743ce));
      auVar14 = vbroadcastss_avx512f(ZEXT416(0x3d2aa9c1));
      auVar15 = vbroadcastss_avx512f(ZEXT416(0x3e2aaaaa));
      auVar16 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar17 = vbroadcastss_avx512f(ZEXT416(0x3c088908));
      auVar18 = vbroadcastss_avx512f(ZEXT416(0x42fe0000));
      do {
        auVar19 = vminps_avx512f(*(undefined1 (*) [64])
                                  (local_50.
                                   super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                   .
                                   super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                   .m_data + uVar6),auVar7);
        auVar19 = vmaxps_avx512f(auVar19,auVar8);
        auVar20 = vfmadd231ps_avx512f(auVar9,auVar19,auVar10);
        auVar20 = vrndscaleps_avx512f(auVar20,1);
        auVar19 = vfmadd231ps_avx512f(auVar19,auVar20,auVar11);
        auVar21 = vmulps_avx512f(auVar19,auVar19);
        auVar22 = vmulps_avx512f(auVar21,auVar19);
        auVar23 = vfmadd213ps_avx512f(auVar12,auVar19,auVar13);
        auVar24 = vfmadd213ps_avx512f(auVar14,auVar19,auVar15);
        auVar25 = vaddps_avx512f(auVar19,auVar16);
        auVar23 = vfmadd213ps_avx512f(auVar23,auVar19,auVar17);
        auVar19 = vfmadd213ps_avx512f(auVar24,auVar19,auVar9);
        auVar19 = vfmadd231ps_avx512f(auVar19,auVar22,auVar23);
        auVar19 = vfmadd213ps_avx512f(auVar19,auVar21,auVar25);
        auVar20 = vaddps_avx512f(auVar20,auVar18);
        auVar20 = vcvttps2dq_avx512f(auVar20);
        auVar20 = vpslld_avx512f(auVar20,0x17);
        auVar19 = vmulps_avx512f(auVar19,auVar20);
        auVar19 = vmaxps_avx512f(*(undefined1 (*) [64])
                                  (local_50.
                                   super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                   .
                                   super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                   .m_data + uVar6),auVar19);
        *(undefined1 (*) [64])
         (local_70.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_data + uVar6) = auVar19;
        uVar6 = uVar6 + 0x10;
      } while ((long)uVar6 < lVar5);
    }
    if (lVar5 < (long)uVar2) {
      do {
        fVar26 = expf(local_50.
                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                      .
                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                      .m_data[lVar5]);
        local_70.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data[lVar5] = fVar26;
        lVar5 = lVar5 + 1;
      } while (uVar2 - lVar5 != 0);
    }
    return;
  }
  __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                "void Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float, -1, -1>>>::resize(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, -1>>]"
               );
}

Assistant:

void Exp::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("Exp not yet implemented for CUDA");
#else
  auto x = **xs[0];
  *fx = x.array().exp();
#endif
}